

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

void DummyProvideTimestep
               (CP_Services Svcs,DP_WS_Stream Stream_v,_SstData *Data,_SstData *LocalMetadata,
               size_t Timestep,void **TimestepInfoPtr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  undefined8 *in_R9;
  _DummyPerTimestepInfo *Info;
  TimestepList Entry;
  Dummy_WS_Stream Stream;
  
  puVar1 = (undefined8 *)malloc(0x20);
  puVar2 = (undefined8 *)malloc(0x10);
  pvVar3 = malloc(0x40);
  *puVar2 = pvVar3;
  snprintf((char *)*puVar2,0x40,"Dummy info for timestep %zd from rank %d",in_R8,
           (ulong)*(uint *)(in_RSI + 0x10));
  *(int *)(puVar2 + 1) = *(int *)(in_RSI + 0x10) * 1000 + (int)in_R8;
  puVar1[1] = in_RDX;
  *puVar1 = in_R8;
  puVar1[2] = puVar2;
  puVar1[3] = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 **)(in_RSI + 0x18) = puVar1;
  *in_R9 = puVar2;
  return;
}

Assistant:

static void DummyProvideTimestep(CP_Services Svcs, DP_WS_Stream Stream_v, struct _SstData *Data,
                                 struct _SstData *LocalMetadata, size_t Timestep,
                                 void **TimestepInfoPtr)
{
    Dummy_WS_Stream Stream = (Dummy_WS_Stream)Stream_v;
    TimestepList Entry = malloc(sizeof(struct _TimestepEntry));
    struct _DummyPerTimestepInfo *Info = malloc(sizeof(struct _DummyPerTimestepInfo));

    Info->CheckString = malloc(64);
    snprintf(Info->CheckString, 64, "Dummy info for timestep %zd from rank %d", Timestep,
             Stream->Rank);
    Info->CheckInt = Stream->Rank * 1000 + (int)Timestep;
    Entry->Data = Data;
    Entry->Timestep = Timestep;
    Entry->DP_TimestepInfo = Info;

    Entry->Next = Stream->Timesteps;
    Stream->Timesteps = Entry;
    *TimestepInfoPtr = Info;
}